

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O0

uchar * generic_asn1(char *value,X509V3_CTX *ctx,size_t *ext_len)

{
  int iVar1;
  uchar *puStack_38;
  int len;
  uchar *ext_der;
  ASN1_TYPE *typ;
  size_t *ext_len_local;
  X509V3_CTX *ctx_local;
  char *value_local;
  
  typ = (ASN1_TYPE *)ext_len;
  ext_len_local = (size_t *)ctx;
  ctx_local = (X509V3_CTX *)value;
  ext_der = (uchar *)ASN1_generate_v3(value,(X509V3_CTX *)ctx);
  if ((ASN1_TYPE *)ext_der == (ASN1_TYPE *)0x0) {
    value_local = (char *)0x0;
  }
  else {
    puStack_38 = (uchar *)0x0;
    iVar1 = i2d_ASN1_TYPE((ASN1_TYPE *)ext_der,&stack0xffffffffffffffc8);
    ASN1_TYPE_free((ASN1_TYPE *)ext_der);
    if (iVar1 < 0) {
      value_local = (char *)0x0;
    }
    else {
      *(long *)typ = (long)iVar1;
      value_local = (char *)puStack_38;
    }
  }
  return (uchar *)value_local;
}

Assistant:

static unsigned char *generic_asn1(const char *value, const X509V3_CTX *ctx,
                                   size_t *ext_len) {
  ASN1_TYPE *typ = ASN1_generate_v3(value, ctx);
  if (typ == NULL) {
    return NULL;
  }
  unsigned char *ext_der = NULL;
  int len = i2d_ASN1_TYPE(typ, &ext_der);
  ASN1_TYPE_free(typ);
  if (len < 0) {
    return NULL;
  }
  *ext_len = len;
  return ext_der;
}